

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O2

void __thiscall
cpsm::testing::TestAssertionFailure::~TestAssertionFailure(TestAssertionFailure *this)

{
  ~TestAssertionFailure(this);
  operator_delete(this);
  return;
}

Assistant:

TestAssertionFailure() : msg_("test assertion failed") {}